

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMSymbolInfo.cpp
# Opt level: O1

int __thiscall ZXing::DataMatrix::SymbolInfo::verticalDataRegions(SymbolInfo *this)

{
  int iVar1;
  int iVar2;
  out_of_range *this_00;
  
  iVar1 = this->_dataRegions;
  if (iVar1 < 0x10) {
    iVar2 = 1;
    if (1 < iVar1 - 1U) {
      if (iVar1 != 4) {
LAB_001591eb:
        this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_00,"Cannot handle this number of data regions");
        __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      iVar2 = 2;
    }
  }
  else if (iVar1 == 0x10) {
    iVar2 = 4;
  }
  else {
    if (iVar1 != 0x24) goto LAB_001591eb;
    iVar2 = 6;
  }
  return iVar2;
}

Assistant:

int
SymbolInfo::verticalDataRegions() const {
	switch (_dataRegions) {
	case 1:  return 1;
	case 2:  return 1;
	case 4:  return 2;
	case 16: return 4;
	case 36: return 6;
	default: throw std::out_of_range("Cannot handle this number of data regions");
	}
}